

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratedFileStream *cmakefileStream,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lGenerators)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  TargetType TVar1;
  pointer ppcVar2;
  ostream *poVar3;
  ulong uVar4;
  pointer ppcVar5;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> tgts;
  string tname;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_78;
  string local_60;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_40;
  ulong local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)cmakefileStream,"# Dependency information for all targets:\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)cmakefileStream,"set(CMAKE_DEPEND_INFO_FILES\n",0x1c);
  ppcVar2 = (lGenerators->
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_40 = lGenerators;
  if ((lGenerators->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppcVar2) {
    uVar4 = 0;
    do {
      this_00 = (cmLocalUnixMakefileGenerator3 *)ppcVar2[uVar4];
      local_38 = uVar4;
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&local_78,
                 &(this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets);
      ppcVar5 = local_78.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (local_78.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_78.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          TVar1 = cmGeneratorTarget::GetType(*ppcVar5);
          if ((((TVar1 == EXECUTABLE) ||
               (TVar1 = cmGeneratorTarget::GetType(*ppcVar5), TVar1 == STATIC_LIBRARY)) ||
              (TVar1 = cmGeneratorTarget::GetType(*ppcVar5), TVar1 == SHARED_LIBRARY)) ||
             (((TVar1 = cmGeneratorTarget::GetType(*ppcVar5), TVar1 == MODULE_LIBRARY ||
               (TVar1 = cmGeneratorTarget::GetType(*ppcVar5), TVar1 == OBJECT_LIBRARY)) ||
              (TVar1 = cmGeneratorTarget::GetType(*ppcVar5), TVar1 == UTILITY)))) {
            cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                      (&local_60,this_00,*ppcVar5);
            std::__cxx11::string::append((char *)&local_60);
            cmsys::SystemTools::ConvertToUnixSlashes(&local_60);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)cmakefileStream,"  \"",3);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)cmakefileStream,local_60._M_dataplus._M_p,
                                local_60._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
          }
          ppcVar5 = ppcVar5 + 1;
        } while (ppcVar5 !=
                 local_78.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_78.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar4 = (ulong)((int)local_38 + 1);
      ppcVar2 = (local_40->
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl
                .super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(local_40->
                                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar2 >> 3)
            );
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)cmakefileStream,"  )\n",4);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3
::WriteMainCMakefileLanguageRules(cmGeneratedFileStream& cmakefileStream,
                                  std::vector<cmLocalGenerator *> &lGenerators
                                  )
{
  cmLocalUnixMakefileGenerator3 *lg;

  // now list all the target info files
  cmakefileStream
    << "# Dependency information for all targets:\n";
  cmakefileStream
    << "set(CMAKE_DEPEND_INFO_FILES\n";
  for (unsigned int i = 0; i < lGenerators.size(); ++i)
    {
    lg = static_cast<cmLocalUnixMakefileGenerator3 *>(lGenerators[i]);
    // for all of out targets
    std::vector<cmGeneratorTarget*> tgts = lg->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator l = tgts.begin();
         l != tgts.end(); l++)
      {
      if(((*l)->GetType() == cmState::EXECUTABLE) ||
         ((*l)->GetType() == cmState::STATIC_LIBRARY) ||
         ((*l)->GetType() == cmState::SHARED_LIBRARY) ||
         ((*l)->GetType() == cmState::MODULE_LIBRARY) ||
         ((*l)->GetType() == cmState::OBJECT_LIBRARY) ||
         ((*l)->GetType() == cmState::UTILITY))
        {
        cmGeneratorTarget* gt = *l;
        std::string tname = lg->GetRelativeTargetDirectory(gt);
        tname += "/DependInfo.cmake";
        cmSystemTools::ConvertToUnixSlashes(tname);
        cmakefileStream << "  \"" << tname << "\"\n";
        }
      }
    }
  cmakefileStream << "  )\n";
}